

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTriangleSphere.h
# Opt level: O1

int __thiscall
pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>::ClassId
          (TPZTriangleSphere<pzgeom::TPZGeoTriangle> *this)

{
  uint uVar1;
  int iVar2;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TPZTriangleSphere","");
  uVar1 = Hash(&local_40);
  iVar2 = TPZGeoTriangle::ClassId(&this->super_TPZGeoTriangle);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZTriangleSphere<GeomTriang>::ClassId() const{
        return Hash("TPZTriangleSphere") ^ GeomTriang::ClassId() << 1;
    }